

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *interfaceNode)

{
  undefined1 auVar1 [16];
  bool *__s;
  uint64_t uVar2;
  ElementCount index;
  ElementCount EVar3;
  ulong elementCount;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Reader method;
  bool _kjCondition;
  undefined1 auStack_197 [15];
  WirePointer *local_188;
  int local_180;
  size_t local_170;
  undefined8 *local_168;
  bool *local_160;
  Array<bool> sawCodeOrder_heap;
  Reader methods;
  anon_class_8_1_60e9c21f _kjContextFunc438;
  anon_class_8_1_6f242a07 local_f0;
  Fault f;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  anon_class_16_2_3f8e8a0c local_b8;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:438:7)>
  _kjContext438;
  bool sawCodeOrder_stack [32];
  
  bVar4 = 4 < (interfaceNode->_reader).pointerCount;
  methods.reader.ptr = (byte *)((interfaceNode->_reader).pointers + 4);
  if (!bVar4) {
    methods.reader.ptr = (byte *)(WirePointer *)0x0;
  }
  methods.reader.elementCount = (interfaceNode->_reader).nestingLimit;
  if (bVar4) {
    methods.reader.segment._0_4_ = *(undefined4 *)&(interfaceNode->_reader).segment;
    methods.reader.segment._4_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).segment + 4);
    methods.reader.capTable._0_4_ = *(undefined4 *)&(interfaceNode->_reader).capTable;
    methods.reader.capTable._4_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).capTable + 4);
  }
  else {
    methods.reader.segment._0_4_ = 0;
    methods.reader.segment._4_4_ = 0;
    methods.reader.capTable._0_4_ = 0;
    methods.reader.capTable._4_4_ = 0;
    methods.reader.elementCount = 0x7fffffff;
  }
  _::PointerReader::getList
            ((ListReader *)&_kjContext438,(PointerReader *)&methods,INLINE_COMPOSITE,(word *)0x0);
  if (_kjContext438.super_Context.value.ptr._0_4_ != 0) {
    EVar3 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&methods,(ListReader *)&_kjContext438,EVar3);
      if (methods.reader.structDataSize < 0x40) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(uint64_t *)methods.reader.ptr;
      }
      validateTypeId(this,uVar2,INTERFACE);
      f.exception._0_4_ = 0;
      f.exception._4_4_ = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
      if (methods.reader.structPointerCount != 0) {
        f.exception._0_4_ = methods.reader.segment._0_4_;
        f.exception._4_4_ = methods.reader.segment._4_4_;
        uStack_e0 = methods.reader.capTable._0_4_;
        uStack_dc = methods.reader.capTable._4_4_;
      }
      _::PointerReader::getStruct(&method._reader,(PointerReader *)&f,(word *)0x0);
      validate(this,(Reader *)&method._reader);
      EVar3 = EVar3 + 1;
    } while (_kjContext438.super_Context.value.ptr._0_4_ != EVar3);
  }
  bVar4 = (interfaceNode->_reader).pointerCount < 4;
  _kjContext438.super_Context._16_8_ = (interfaceNode->_reader).pointers + 3;
  if (bVar4) {
    _kjContext438.super_Context._16_8_ = (WirePointer *)0x0;
  }
  _kjContext438.super_Context.value.ptr._0_4_ = (interfaceNode->_reader).nestingLimit;
  if (bVar4) {
    uVar6 = 0;
    uVar7 = 0;
    _kjContext438.super_Context.super_ExceptionCallback.next._0_4_ = 0;
    _kjContext438.super_Context.super_ExceptionCallback.next._4_4_ = 0;
    _kjContext438.super_Context.value.ptr._0_4_ = 0x7fffffff;
  }
  else {
    uVar6 = *(undefined4 *)&(interfaceNode->_reader).segment;
    uVar7 = *(undefined4 *)((long)&(interfaceNode->_reader).segment + 4);
    _kjContext438.super_Context.super_ExceptionCallback.next._0_4_ =
         *(undefined4 *)&(interfaceNode->_reader).capTable;
    _kjContext438.super_Context.super_ExceptionCallback.next._4_4_ =
         *(undefined4 *)((long)&(interfaceNode->_reader).capTable + 4);
  }
  _kjContext438.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)CONCAT44(uVar7,uVar6);
  _::PointerReader::getList
            (&methods.reader,(PointerReader *)&_kjContext438,INLINE_COMPOSITE,(word *)0x0);
  elementCount = (ulong)methods.reader.elementCount;
  if (elementCount < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
    __s = sawCodeOrder_stack;
    local_168 = (undefined8 *)0x0;
  }
  else {
    __s = (bool *)kj::_::HeapArrayDisposer::allocateImpl
                            (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
    local_168 = &kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.ptr = __s;
    sawCodeOrder_heap.size_ = elementCount;
  }
  local_170 = sawCodeOrder_heap.size_;
  local_160 = sawCodeOrder_heap.ptr;
  memset(__s,0,elementCount);
  if (methods.reader.elementCount != 0) {
    EVar3 = methods.reader.elementCount - 1;
    index = 0;
    do {
      _::ListReader::getStructElement(&method._reader,&methods.reader,index);
      _kjContextFunc438.method = (Reader *)&method._reader;
      kj::_::Debug::Context::Context(&_kjContext438.super_Context);
      _kjContext438.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
           (_func_int **)&PTR__Context_001bcf78;
      _kjContext438.func = &_kjContextFunc438;
      f.exception._0_4_ = 0;
      f.exception._4_4_ = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
      if (method._reader.pointerCount != 0) {
        f.exception._0_4_ = method._reader.segment._0_4_;
        f.exception._4_4_ = method._reader.segment._4_4_;
        uStack_e0 = method._reader.capTable._0_4_;
        uStack_dc = method._reader.capTable._4_4_;
      }
      __kjCondition =
           (ArrayPtr<const_char>)
           _::PointerReader::getBlob<capnp::Text>((PointerReader *)&f,(void *)0x0,0);
      local_f0.update = &local_b8;
      _f = __kjCondition;
      local_b8.name = (StringPtr *)&_kjCondition;
      local_b8.this = this;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                ((Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                  *)&this->members,(Entry *)&f,&local_f0);
      if (method._reader.dataSize < 0x10) {
        if (methods.reader.elementCount == 0) {
LAB_0013fc4f:
          auVar1[0xf] = 0;
          auVar1._0_15_ = auStack_197;
          __kjCondition = (ArrayPtr<const_char>)(auVar1 << 8);
        }
        else {
          _kjCondition = (bool)(*__s ^ 1);
          if (*__s == false) {
            *__s = true;
LAB_0013fc4b:
            uVar2 = 0;
            goto LAB_0013fc9e;
          }
        }
LAB_0013fc54:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1bb,FAILED,
                   "method.getCodeOrder() < methods.size() && !sawCodeOrder[method.getCodeOrder()]",
                   "_kjCondition,\"invalid codeOrder\"",&_kjCondition,
                   (char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f);
        bVar4 = true;
      }
      else {
        if (methods.reader.elementCount <= *method._reader.data) goto LAB_0013fc4f;
        _kjCondition = (bool)(__s[*method._reader.data] ^ 1);
        if (__s[*method._reader.data] != false) goto LAB_0013fc54;
        __s[*method._reader.data] = true;
        if (method._reader.dataSize < 0x80) goto LAB_0013fc4b;
        uVar2 = *(uint64_t *)((long)method._reader.data + 8);
LAB_0013fc9e:
        validateTypeId(this,uVar2,STRUCT);
        local_188 = method._reader.pointers + 2;
        __kjCondition = method._reader.segment._0_4_;
        auStack_197._3_4_ = method._reader.segment._4_4_;
        auStack_197._7_4_ = method._reader.capTable._0_4_;
        auStack_197._11_4_ = method._reader.capTable._4_4_;
        local_180 = method._reader.nestingLimit;
        if (method._reader.pointerCount < 3) {
          local_188 = (WirePointer *)0x0;
          __kjCondition = 0;
          auStack_197._3_4_ = 0;
          auStack_197._7_4_ = 0;
          auStack_197._11_4_ = 0;
          local_180 = 0x7fffffff;
        }
        _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&_kjCondition,(word *)0x0);
        validate(this,(Reader *)&f);
        if (method._reader.dataSize < 0xc0) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(uint64_t *)((long)method._reader.data + 0x10);
        }
        validateTypeId(this,uVar2,STRUCT);
        local_188 = method._reader.pointers + 3;
        __kjCondition = method._reader.segment._0_4_;
        auStack_197._3_4_ = method._reader.segment._4_4_;
        auStack_197._7_4_ = method._reader.capTable._0_4_;
        auStack_197._11_4_ = method._reader.capTable._4_4_;
        local_180 = method._reader.nestingLimit;
        if (method._reader.pointerCount < 4) {
          local_188 = (WirePointer *)0x0;
          __kjCondition = 0;
          auStack_197._3_4_ = 0;
          auStack_197._7_4_ = 0;
          auStack_197._11_4_ = 0;
          local_180 = 0x7fffffff;
        }
        _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&_kjCondition,(word *)0x0);
        validate(this,(Reader *)&f);
        bVar4 = false;
      }
      kj::_::Debug::Context::~Context(&_kjContext438.super_Context);
      bVar5 = EVar3 != index;
      index = index + 1;
    } while (!bVar4 && bVar5);
  }
  if (local_160 != (bool *)0x0) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    (**(code **)*local_168)(local_168,local_160,1,local_170,local_170,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Interface::Reader& interfaceNode) {
    for (auto extend: interfaceNode.getSuperclasses()) {
      validateTypeId(extend.getId(), schema::Node::INTERFACE);
      validate(extend.getBrand());
    }

    auto methods = interfaceNode.getMethods();
    KJ_STACK_ARRAY(bool, sawCodeOrder, methods.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto method: methods) {
      KJ_CONTEXT("validating method", method.getName());
      validateMemberName(method.getName(), index++);

      VALIDATE_SCHEMA(method.getCodeOrder() < methods.size() &&
                      !sawCodeOrder[method.getCodeOrder()],
                      "invalid codeOrder");
      sawCodeOrder[method.getCodeOrder()] = true;

      validateTypeId(method.getParamStructType(), schema::Node::STRUCT);
      validate(method.getParamBrand());
      validateTypeId(method.getResultStructType(), schema::Node::STRUCT);
      validate(method.getResultBrand());
    }
  }